

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

BOOL is_accelerated_repeat(PCRE2_SPTR16 cc)

{
  ulong uVar1;
  
  switch(*cc) {
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x37:
  case 0x38:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x51:
  case 0x52:
    return 1;
  default:
    goto switchD_001541c9_caseD_25;
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5e:
  case 0x5f:
    return (BOOL)(cc[1] != 0x16 && cc[1] != 0x11);
  case 0x6e:
  case 0x6f:
    uVar1 = 0x11;
    break;
  case 0x70:
    uVar1 = (ulong)cc[1];
  }
  if ((ushort)(cc[uVar1] - 0x62) < 10) {
    return *(BOOL *)(&DAT_001f00e4 + (ulong)(ushort)(cc[uVar1] - 0x62) * 4);
  }
switchD_001541c9_caseD_25:
  return 0;
}

Assistant:

static BOOL is_accelerated_repeat(PCRE2_SPTR cc)
{
switch(*cc)
  {
  case OP_TYPESTAR:
  case OP_TYPEMINSTAR:
  case OP_TYPEPLUS:
  case OP_TYPEMINPLUS:
  case OP_TYPEPOSSTAR:
  case OP_TYPEPOSPLUS:
  return (cc[1] != OP_ANYNL && cc[1] != OP_EXTUNI);

  case OP_STAR:
  case OP_MINSTAR:
  case OP_PLUS:
  case OP_MINPLUS:
  case OP_POSSTAR:
  case OP_POSPLUS:

  case OP_STARI:
  case OP_MINSTARI:
  case OP_PLUSI:
  case OP_MINPLUSI:
  case OP_POSSTARI:
  case OP_POSPLUSI:

  case OP_NOTSTAR:
  case OP_NOTMINSTAR:
  case OP_NOTPLUS:
  case OP_NOTMINPLUS:
  case OP_NOTPOSSTAR:
  case OP_NOTPOSPLUS:

  case OP_NOTSTARI:
  case OP_NOTMINSTARI:
  case OP_NOTPLUSI:
  case OP_NOTMINPLUSI:
  case OP_NOTPOSSTARI:
  case OP_NOTPOSPLUSI:
  return TRUE;

  case OP_CLASS:
  case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
  case OP_XCLASS:
  cc += (*cc == OP_XCLASS) ? GET(cc, 1) : (int)(1 + (32 / sizeof(PCRE2_UCHAR)));
#else
  cc += (1 + (32 / sizeof(PCRE2_UCHAR)));
#endif

  switch(*cc)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSSTAR:
    case OP_CRPOSPLUS:
    return TRUE;
    }
  break;
  }
return FALSE;
}